

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

int4 __thiscall CParse::lookupIdentifier(CParse *this,string *nm)

{
  uint uVar1;
  bool bVar2;
  reference ppVar3;
  GRAMMARSTYPE GVar4;
  Datatype *tp;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_28;
  const_iterator iter;
  string *nm_local;
  CParse *this_local;
  
  iter._M_node = (_Base_ptr)nm;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(&this->keywords,nm);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  tp = (Datatype *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&this->keywords);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::_Rb_tree_const_iterator(&local_38,(iterator *)&tp);
  bVar2 = std::operator!=(&local_28,&local_38);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator*(&local_28);
    uVar1 = ppVar3->second;
    if ((((uVar1 - 1 < 2) || (uVar1 == 4)) || (uVar1 == 8)) || (uVar1 == 0x10)) {
      return 0x10b;
    }
    if (((uVar1 == 0x20) || (uVar1 == 0x40)) || (uVar1 == 0x80)) {
      return 0x10c;
    }
    if (uVar1 == 0x100) {
      return 0x10d;
    }
    if (uVar1 == 0x200) {
      return 0x104;
    }
    if (uVar1 == 0x400) {
      return 0x105;
    }
    if (uVar1 == 0x800) {
      return 0x106;
    }
  }
  GVar4.type = TypeFactory::findByName(this->glb->types,(string *)iter._M_node);
  if (GVar4.dec == (TypeDeclarator *)0x0) {
    bVar2 = Architecture::hasModel(this->glb,(string *)iter._M_node);
    if (bVar2) {
      this_local._4_4_ = 0x10d;
    }
    else {
      this_local._4_4_ = 0x10a;
    }
  }
  else {
    this_local._4_4_ = 0x10e;
    grammarlval.type = GVar4.type;
  }
  return this_local._4_4_;
}

Assistant:

int4 CParse::lookupIdentifier(const string &nm)

{
  map<string,uint4>::const_iterator iter = keywords.find(nm);
  if (iter != keywords.end()) {
    switch( (*iter).second ) {
    case f_typedef:
    case f_extern:
    case f_static:
    case f_auto:
    case f_register:
      return STORAGE_CLASS_SPECIFIER;
    case f_const:
    case f_restrict:
    case f_volatile:
      return TYPE_QUALIFIER;
    case f_inline:
      return FUNCTION_SPECIFIER;
    case f_struct:
      return STRUCT;
    case f_union:
      return UNION;
    case f_enum:
      return ENUM;
    default:
      break;
    }
  }
  Datatype *tp = glb->types->findByName(nm);
  if (tp != (Datatype *)0) {
    yylval.type = tp;
    return TYPE_NAME;
  }
  if (glb->hasModel(nm))
    return FUNCTION_SPECIFIER;
  return IDENTIFIER;		// Unknown identifier
}